

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

void stats_arena_print(emitter_t *emitter,uint i,_Bool bins,_Bool large,_Bool mutex,_Bool extents,
                      _Bool hpa)

{
  int iVar1;
  emitter_t *emitter_00;
  emitter_type_t in_ECX;
  byte in_DL;
  uint in_ESI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  byte in_stack_00000008;
  size_t sz_39;
  size_t miblen_38;
  size_t mib_38 [7];
  size_t sz_38;
  size_t miblen_37;
  size_t mib_37 [7];
  size_t sz_37;
  size_t miblen_36;
  size_t mib_36 [7];
  size_t sz_36;
  size_t miblen_35;
  size_t mib_35 [7];
  size_t sz_35;
  size_t miblen_34;
  size_t mib_34 [7];
  size_t sz_34;
  size_t miblen_33;
  size_t mib_33 [7];
  size_t sz_33;
  size_t miblen_32;
  size_t mib_32 [7];
  size_t sz_32;
  size_t miblen_31;
  size_t mib_31 [7];
  size_t sz_31;
  size_t miblen_30;
  size_t mib_30 [7];
  size_t sz_30;
  size_t miblen_29;
  size_t mib_29 [7];
  size_t sz_29;
  size_t miblen_28;
  size_t mib_28 [7];
  size_t sz_28;
  size_t miblen_27;
  size_t mib_27 [7];
  emitter_col_t mem_count_val;
  emitter_col_t mem_count_title;
  emitter_row_t mem_count_row;
  size_t sz_27;
  size_t miblen_26;
  size_t mib_26 [7];
  size_t sz_26;
  size_t miblen_25;
  size_t mib_25 [7];
  size_t sz_25;
  size_t miblen_24;
  size_t mib_24 [7];
  size_t sz_24;
  size_t miblen_23;
  size_t mib_23 [7];
  size_t sz_23;
  size_t miblen_22;
  size_t mib_22 [7];
  size_t sz_22;
  size_t miblen_21;
  size_t mib_21 [7];
  size_t sz_21;
  size_t miblen_20;
  size_t mib_20 [7];
  size_t sz_20;
  size_t miblen_19;
  size_t mib_19 [7];
  size_t sz_19;
  size_t miblen_18;
  size_t mib_18 [7];
  size_t sz_18;
  size_t miblen_17;
  size_t mib_17 [7];
  size_t sz_17;
  size_t miblen_16;
  size_t mib_16 [7];
  size_t sz_16;
  size_t miblen_15;
  size_t mib_15 [7];
  emitter_col_t col_count_nflushes_ps;
  emitter_col_t col_count_nflushes;
  emitter_col_t col_count_nfills_ps;
  emitter_col_t col_count_nfills;
  emitter_col_t col_count_nrequests_ps;
  emitter_col_t col_count_nrequests;
  emitter_col_t col_count_ndalloc_ps;
  emitter_col_t col_count_ndalloc;
  emitter_col_t col_count_nmalloc_ps;
  emitter_col_t col_count_nmalloc;
  emitter_col_t col_count_allocated;
  emitter_col_t col_count_title;
  emitter_row_t alloc_count_row;
  emitter_col_t col_decay_purged;
  emitter_col_t col_decay_madvises;
  emitter_col_t col_decay_sweeps;
  emitter_col_t col_decay_npages;
  emitter_col_t col_decay_time;
  emitter_col_t col_decay_type;
  emitter_row_t decay_row;
  size_t sz_15;
  size_t miblen_14;
  size_t mib_14 [7];
  size_t sz_14;
  size_t miblen_13;
  size_t mib_13 [7];
  size_t sz_13;
  size_t miblen_12;
  size_t mib_12 [7];
  size_t sz_12;
  size_t miblen_11;
  size_t mib_11 [7];
  size_t sz_11;
  size_t miblen_10;
  size_t mib_10 [7];
  size_t sz_10;
  size_t miblen_9;
  size_t mib_9 [7];
  size_t sz_9;
  size_t miblen_8;
  size_t mib_8 [7];
  size_t sz_8;
  size_t miblen_7;
  size_t mib_7 [7];
  size_t sz_7;
  size_t miblen_6;
  size_t mib_6 [7];
  size_t sz_6;
  size_t miblen_5;
  size_t mib_5 [7];
  size_t sz_5;
  size_t miblen_4;
  size_t mib_4 [7];
  size_t sz_4;
  size_t miblen_3;
  size_t mib_3 [7];
  size_t sz_3;
  size_t miblen_2;
  size_t mib_2 [7];
  size_t sz_2;
  size_t miblen_1;
  size_t mib_1 [7];
  size_t sz_1;
  size_t miblen;
  size_t mib [7];
  size_t sz;
  uint64_t uptime;
  size_t abandoned_vm;
  size_t tcache_stashed_bytes;
  size_t tcache_bytes;
  uint64_t large_nflushes;
  uint64_t large_nfills;
  uint64_t large_nrequests;
  uint64_t large_ndalloc;
  uint64_t large_nmalloc;
  size_t large_allocated;
  uint64_t small_nflushes;
  uint64_t small_nfills;
  uint64_t small_nrequests;
  uint64_t small_ndalloc;
  uint64_t small_nmalloc;
  size_t small_allocated;
  uint64_t muzzy_purged;
  uint64_t muzzy_nmadvise;
  uint64_t muzzy_npurge;
  uint64_t dirty_purged;
  uint64_t dirty_nmadvise;
  uint64_t dirty_npurge;
  size_t extent_avail;
  size_t metadata_thp;
  size_t metadata_rtree;
  size_t metadata_edata;
  size_t resident;
  size_t internal;
  size_t base;
  size_t retained;
  size_t mapped;
  size_t pmuzzy;
  size_t pdirty;
  size_t pactive;
  size_t page;
  ssize_t muzzy_decay_ms;
  ssize_t dirty_decay_ms;
  char *dss;
  uint nthreads;
  char *namep;
  char name [32];
  undefined4 in_stack_ffffffffffffef18;
  emitter_row_t *in_stack_ffffffffffffef28;
  emitter_row_t *row;
  emitter_t *in_stack_ffffffffffffef30;
  emitter_t *emitter_01;
  size_t *in_stack_ffffffffffffef38;
  emitter_t *in_stack_ffffffffffffef40;
  size_t in_stack_ffffffffffffef48;
  size_t *in_stack_ffffffffffffef50;
  uint64_t in_stack_fffffffffffff198;
  uint in_stack_fffffffffffff1a4;
  emitter_t *emitter_02;
  emitter_col_t local_d20;
  emitter_col_t local_cf8;
  emitter_row_t local_cd0;
  undefined8 local_cc8;
  undefined8 local_cc0;
  uint in_stack_fffffffffffff354;
  uint64_t in_stack_fffffffffffff558;
  uint in_stack_fffffffffffff564;
  emitter_t *emitter_03;
  emitter_col_t local_908;
  emitter_col_t local_8e0;
  emitter_col_t local_8b8;
  emitter_col_t local_890;
  emitter_col_t local_868;
  emitter_col_t local_840;
  emitter_col_t local_818;
  emitter_col_t local_7f0;
  emitter_col_t local_7c8;
  emitter_col_t local_7a0;
  emitter_col_t local_778;
  emitter_justify_t local_750;
  int local_74c;
  emitter_type_t local_748;
  char *uptime_00;
  uint in_stack_fffffffffffff8cc;
  emitter_col_t *in_stack_fffffffffffff8d0;
  emitter_row_t local_728;
  emitter_col_t local_720;
  emitter_col_t local_6f8;
  emitter_col_t local_6d0;
  emitter_col_t local_6a8;
  emitter_col_t local_680;
  emitter_col_t local_658;
  emitter_row_t local_630;
  undefined8 local_628;
  undefined8 local_620;
  ulong local_608;
  undefined8 local_5d8;
  undefined8 local_5d0;
  ulong local_5b8;
  undefined8 local_588;
  undefined8 local_580;
  ulong local_568;
  undefined8 local_538;
  undefined8 local_530;
  ulong local_518;
  undefined8 local_4e8;
  undefined8 local_4e0;
  ulong local_4c8;
  undefined8 local_498;
  undefined8 local_490;
  ulong local_478;
  undefined8 local_448;
  undefined8 local_440;
  ulong local_428;
  undefined8 local_3f8;
  undefined8 local_3f0;
  ulong local_3d8;
  undefined8 local_3a8;
  undefined8 local_3a0;
  ulong local_388;
  undefined8 local_358;
  undefined8 local_350;
  ulong local_338;
  undefined8 local_308;
  undefined8 local_300;
  ulong local_2e8;
  undefined8 local_2b8;
  undefined8 local_2b0;
  ulong local_298;
  undefined8 local_268;
  undefined8 local_260;
  ulong local_248;
  undefined8 local_218;
  undefined8 local_210;
  ulong local_1f8;
  undefined8 local_1c8;
  undefined8 local_1c0;
  ulong local_1b0;
  undefined8 local_180;
  uint64_t local_178;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_170;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_168;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_160;
  uint64_t local_158;
  uint64_t local_150;
  uint64_t local_148;
  uint64_t local_140;
  uint64_t local_138;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_130;
  uint64_t local_128;
  uint64_t local_120;
  uint64_t local_118;
  uint64_t local_110;
  uint64_t local_108;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_100;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_f8;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_f0;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_e8;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_e0;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_d8;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_d0;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_c8;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_c0;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_b8;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_b0;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_a8;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_a0;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_98;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_90;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_88;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_80;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_78;
  long local_70;
  long local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_40;
  undefined1 local_38 [39];
  byte local_11;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  uint local_c;
  
  local_d = in_DL & 1;
  local_e = (byte)in_ECX & 1;
  local_f = (byte)in_R8D & 1;
  local_10 = (byte)in_R9D & 1;
  local_11 = in_stack_00000008 & 1;
  local_40 = local_38;
  local_180 = 8;
  local_c = in_ESI;
  iVar1 = duckdb_je_mallctl((char *)in_stack_ffffffffffffef40,in_stack_ffffffffffffef38,
                            (size_t *)in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,
                            CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","arenas.page");
    abort();
  }
  if ((local_c != 0x1000) && (local_c != 0x1001)) {
    local_1c0 = 7;
    local_1c8 = 8;
    iVar1 = duckdb_je_mallctlnametomib
                      ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                       (size_t *)CONCAT44(in_ECX,in_R8D));
    if (iVar1 != 0) {
      duckdb_je_malloc_printf
                ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n","arena.0.name");
      abort();
    }
    local_1b0 = (ulong)local_c;
    iVar1 = duckdb_je_mallctlbymib
                      (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40
                       ,in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                       (size_t)in_stack_ffffffffffffef28);
    if (iVar1 != 0) {
      duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
      abort();
    }
    emitter_kv(in_stack_ffffffffffffef40,(char *)in_stack_ffffffffffffef38,
               (char *)in_stack_ffffffffffffef30,
               (emitter_type_t)((ulong)in_stack_ffffffffffffef28 >> 0x20),
               (void *)CONCAT44(in_ECX,in_R8D));
  }
  local_210 = 7;
  local_218 = 4;
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n","stats.arenas.0.nthreads");
    abort();
  }
  local_1f8 = (ulong)local_c;
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  emitter_kv(in_stack_ffffffffffffef40,(char *)in_stack_ffffffffffffef38,
             (char *)in_stack_ffffffffffffef30,
             (emitter_type_t)((ulong)in_stack_ffffffffffffef28 >> 0x20),
             (void *)CONCAT44(in_ECX,in_R8D));
  local_260 = 7;
  local_268 = 8;
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n","stats.arenas.0.uptime");
    abort();
  }
  local_248 = (ulong)local_c;
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  emitter_kv(in_stack_ffffffffffffef40,(char *)in_stack_ffffffffffffef38,
             (char *)in_stack_ffffffffffffef30,
             (emitter_type_t)((ulong)in_stack_ffffffffffffef28 >> 0x20),
             (void *)CONCAT44(in_ECX,in_R8D));
  local_2b0 = 7;
  local_2b8 = 8;
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n","stats.arenas.0.dss");
    abort();
  }
  local_298 = (ulong)local_c;
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  emitter_kv(in_stack_ffffffffffffef40,(char *)in_stack_ffffffffffffef38,
             (char *)in_stack_ffffffffffffef30,
             (emitter_type_t)((ulong)in_stack_ffffffffffffef28 >> 0x20),
             (void *)CONCAT44(in_ECX,in_R8D));
  local_300 = 7;
  local_308 = 8;
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
               "stats.arenas.0.dirty_decay_ms");
    abort();
  }
  local_2e8 = (ulong)local_c;
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  local_350 = 7;
  local_358 = 8;
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
               "stats.arenas.0.muzzy_decay_ms");
    abort();
  }
  local_338 = (ulong)local_c;
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  local_3a0 = 7;
  local_3a8 = 8;
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n","stats.arenas.0.pactive");
    abort();
  }
  local_388 = (ulong)local_c;
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  local_3f0 = 7;
  local_3f8 = 8;
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n","stats.arenas.0.pdirty");
    abort();
  }
  local_3d8 = (ulong)local_c;
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  local_440 = 7;
  local_448 = 8;
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n","stats.arenas.0.pmuzzy");
    abort();
  }
  local_428 = (ulong)local_c;
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  local_490 = 7;
  local_498 = 8;
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
               "stats.arenas.0.dirty_npurge");
    abort();
  }
  local_478 = (ulong)local_c;
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  local_4e0 = 7;
  local_4e8 = 8;
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
               "stats.arenas.0.dirty_nmadvise");
    abort();
  }
  local_4c8 = (ulong)local_c;
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  local_530 = 7;
  local_538 = 8;
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
               "stats.arenas.0.dirty_purged");
    abort();
  }
  local_518 = (ulong)local_c;
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  local_580 = 7;
  local_588 = 8;
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
               "stats.arenas.0.muzzy_npurge");
    abort();
  }
  local_568 = (ulong)local_c;
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  local_5d0 = 7;
  local_5d8 = 8;
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
               "stats.arenas.0.muzzy_nmadvise");
    abort();
  }
  local_5b8 = (ulong)local_c;
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  local_620 = 7;
  local_628 = 8;
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
               "stats.arenas.0.muzzy_purged");
    abort();
  }
  local_608 = (ulong)local_c;
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  emitter_row_init(&local_630);
  emitter_json_kv(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28,in_ECX,
                  (void *)CONCAT44(in_R9D,in_stack_ffffffffffffef18));
  emitter_json_kv(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28,in_ECX,
                  (void *)CONCAT44(in_R9D,in_stack_ffffffffffffef18));
  emitter_json_kv(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28,in_ECX,
                  (void *)CONCAT44(in_R9D,in_stack_ffffffffffffef18));
  emitter_json_kv(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28,in_ECX,
                  (void *)CONCAT44(in_R9D,in_stack_ffffffffffffef18));
  emitter_json_kv(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28,in_ECX,
                  (void *)CONCAT44(in_R9D,in_stack_ffffffffffffef18));
  emitter_json_kv(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28,in_ECX,
                  (void *)CONCAT44(in_R9D,in_stack_ffffffffffffef18));
  emitter_json_kv(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28,in_ECX,
                  (void *)CONCAT44(in_R9D,in_stack_ffffffffffffef18));
  emitter_json_kv(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28,in_ECX,
                  (void *)CONCAT44(in_R9D,in_stack_ffffffffffffef18));
  emitter_json_kv(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28,in_ECX,
                  (void *)CONCAT44(in_R9D,in_stack_ffffffffffffef18));
  emitter_json_kv(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28,in_ECX,
                  (void *)CONCAT44(in_R9D,in_stack_ffffffffffffef18));
  emitter_json_kv(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28,in_ECX,
                  (void *)CONCAT44(in_R9D,in_stack_ffffffffffffef18));
  emitter_col_init(&local_658,&local_630);
  local_658.justify = emitter_justify_right;
  local_658.width = 9;
  local_658.type = emitter_type_title;
  local_658.field_3.str_val = "decaying:";
  emitter_col_init(&local_680,&local_630);
  local_680.justify = emitter_justify_right;
  local_680.width = 6;
  local_680.type = emitter_type_title;
  local_680.field_3.str_val = "time";
  emitter_col_init(&local_6a8,&local_630);
  local_6a8.justify = emitter_justify_right;
  local_6a8.width = 0xd;
  local_6a8.type = emitter_type_title;
  local_6a8.field_3.str_val = "npages";
  emitter_col_init(&local_6d0,&local_630);
  local_6d0.justify = emitter_justify_right;
  local_6d0.width = 0xd;
  local_6d0.type = emitter_type_title;
  local_6d0.field_3.str_val = "sweeps";
  emitter_col_init(&local_6f8,&local_630);
  local_6f8.justify = emitter_justify_right;
  local_6f8.width = 0xd;
  local_6f8.type = emitter_type_title;
  local_6f8.field_3.str_val = "madvises";
  emitter_col_init(&local_720,&local_630);
  local_720.justify = emitter_justify_right;
  local_720.width = 0xd;
  local_720.type = emitter_type_title;
  local_720.field_3.str_val = "purged";
  emitter_table_row(in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
  local_658.field_3.str_val = "dirty:";
  if ((long)local_58 < 0) {
    local_680.type = emitter_type_title;
    local_680.field_3.str_val = "N/A";
  }
  else {
    local_680.type = emitter_type_ssize;
    local_680.field_3.str_val = local_58;
  }
  local_6a8.type = emitter_type_size;
  local_6a8.field_3 = local_78;
  local_6d0.type = emitter_type_uint64;
  local_6d0.field_3 = local_d0;
  local_6f8.type = emitter_type_uint64;
  local_6f8.field_3 = local_d8;
  local_720.type = emitter_type_uint64;
  local_720.field_3 = local_e0;
  emitter_table_row(in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
  local_658.field_3.str_val = "muzzy:";
  if ((long)local_60 < 0) {
    local_680.type = emitter_type_title;
    local_680.field_3.str_val = "N/A";
  }
  else {
    local_680.type = emitter_type_ssize;
    local_680.field_3.str_val = local_60;
  }
  local_6a8.type = emitter_type_size;
  local_6a8.field_3 = local_80;
  local_6d0.type = emitter_type_uint64;
  local_6d0.field_3 = local_e8;
  local_6f8.type = emitter_type_uint64;
  local_6f8.field_3 = local_f0;
  local_720.type = emitter_type_uint64;
  local_720.field_3 = local_f8;
  emitter_table_row(in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
  emitter_row_init(&local_728);
  emitter_col_init((emitter_col_t *)&local_750,&local_728);
  local_750 = emitter_justify_left;
  local_74c = 0x15;
  local_748 = emitter_type_title;
  emitter_col_init(&local_778,&local_728);
  local_778.justify = emitter_justify_right;
  local_778.width = 0x10;
  local_778.type = emitter_type_title;
  local_778.field_3.str_val = "allocated";
  emitter_col_init(&local_7a0,&local_728);
  local_7a0.justify = emitter_justify_right;
  local_7a0.width = 0x10;
  local_7a0.type = emitter_type_title;
  local_7a0.field_3.str_val = "nmalloc";
  emitter_col_init(&local_7c8,&local_728);
  local_7c8.justify = emitter_justify_right;
  local_7c8.width = 10;
  local_7c8.type = emitter_type_title;
  local_7c8.field_3.str_val = "(#/sec)";
  emitter_col_init(&local_7f0,&local_728);
  local_7f0.justify = emitter_justify_right;
  local_7f0.width = 0x10;
  local_7f0.type = emitter_type_title;
  local_7f0.field_3.str_val = "ndalloc";
  emitter_col_init(&local_818,&local_728);
  local_818.justify = emitter_justify_right;
  local_818.width = 10;
  local_818.type = emitter_type_title;
  local_818.field_3.str_val = "(#/sec)";
  emitter_col_init(&local_840,&local_728);
  local_840.justify = emitter_justify_right;
  local_840.width = 0x10;
  local_840.type = emitter_type_title;
  local_840.field_3.str_val = "nrequests";
  emitter_col_init(&local_868,&local_728);
  local_868.justify = emitter_justify_right;
  local_868.width = 10;
  local_868.type = emitter_type_title;
  local_868.field_3.str_val = "(#/sec)";
  emitter_col_init(&local_890,&local_728);
  local_890.justify = emitter_justify_right;
  local_890.width = 0x10;
  local_890.type = emitter_type_title;
  local_890.field_3.str_val = "nfill";
  emitter_col_init(&local_8b8,&local_728);
  local_8b8.justify = emitter_justify_right;
  local_8b8.width = 10;
  local_8b8.type = emitter_type_title;
  local_8b8.field_3.str_val = "(#/sec)";
  emitter_col_init(&local_8e0,&local_728);
  local_8e0.justify = emitter_justify_right;
  local_8e0.width = 0x10;
  local_8e0.type = emitter_type_title;
  local_8e0.field_3.str_val = "nflush";
  emitter_col_init(&local_908,&local_728);
  local_908.justify = emitter_justify_right;
  local_908.width = 10;
  local_908.type = emitter_type_title;
  local_908.field_3.str_val = "(#/sec)";
  emitter_table_row(in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
  local_7c8.type = emitter_type_uint64;
  local_818.type = emitter_type_uint64;
  local_868.type = emitter_type_uint64;
  local_8b8.type = emitter_type_uint64;
  local_908.type = emitter_type_uint64;
  emitter_json_object_kv_begin
            ((emitter_t *)CONCAT44(in_ECX,in_R8D),(char *)CONCAT44(in_R9D,in_stack_ffffffffffffef18)
            );
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
               "stats.arenas.0.small.allocated");
    abort();
  }
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  emitter_json_kv(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28,in_ECX,
                  (void *)CONCAT44(in_R9D,in_stack_ffffffffffffef18));
  local_778.type = emitter_type_size;
  local_778.field_3 = local_100;
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
               "stats.arenas.0.small.nmalloc");
    abort();
  }
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  emitter_json_kv(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28,in_ECX,
                  (void *)CONCAT44(in_R9D,in_stack_ffffffffffffef18));
  local_7a0.type = emitter_type_uint64;
  local_7a0.field_3.uint64_val = local_108;
  local_7c8.field_3.uint64_val = rate_per_second(local_108,local_178);
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
               "stats.arenas.0.small.ndalloc");
    abort();
  }
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  emitter_json_kv(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28,in_ECX,
                  (void *)CONCAT44(in_R9D,in_stack_ffffffffffffef18));
  local_7f0.type = emitter_type_uint64;
  local_7f0.field_3.uint64_val = local_110;
  local_818.field_3.uint64_val = rate_per_second(local_110,local_178);
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
               "stats.arenas.0.small.nrequests");
    abort();
  }
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  emitter_json_kv(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28,in_ECX,
                  (void *)CONCAT44(in_R9D,in_stack_ffffffffffffef18));
  local_840.type = emitter_type_uint64;
  local_840.field_3.uint64_val = local_118;
  local_868.field_3.uint64_val = rate_per_second(local_118,local_178);
  emitter_03 = (emitter_t *)0x8;
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
               "stats.arenas.0.small.nfills");
    abort();
  }
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  emitter_json_kv(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28,in_ECX,
                  (void *)CONCAT44(in_R9D,in_stack_ffffffffffffef18));
  local_890.type = emitter_type_uint64;
  local_890.field_3.uint64_val = local_120;
  local_8b8.field_3.uint64_val = rate_per_second(local_120,local_178);
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
               "stats.arenas.0.small.nflushes");
    abort();
  }
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  emitter_json_kv(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28,in_ECX,
                  (void *)CONCAT44(in_R9D,in_stack_ffffffffffffef18));
  local_8e0.type = emitter_type_uint64;
  local_8e0.field_3.uint64_val = local_128;
  local_908.field_3.uint64_val = rate_per_second(local_128,local_178);
  emitter_table_row(in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
  emitter_json_object_end((emitter_t *)0x2571a6c);
  emitter_json_object_kv_begin
            ((emitter_t *)CONCAT44(in_ECX,in_R8D),(char *)CONCAT44(in_R9D,in_stack_ffffffffffffef18)
            );
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
               "stats.arenas.0.large.allocated");
    abort();
  }
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  emitter_json_kv(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28,in_ECX,
                  (void *)CONCAT44(in_R9D,in_stack_ffffffffffffef18));
  local_778.type = emitter_type_size;
  local_778.field_3 = local_130;
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
               "stats.arenas.0.large.nmalloc");
    abort();
  }
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  emitter_json_kv(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28,in_ECX,
                  (void *)CONCAT44(in_R9D,in_stack_ffffffffffffef18));
  local_7a0.type = emitter_type_uint64;
  local_7a0.field_3.uint64_val = local_138;
  local_7c8.field_3.uint64_val = rate_per_second(local_138,local_178);
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
               "stats.arenas.0.large.ndalloc");
    abort();
  }
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  emitter_json_kv(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28,in_ECX,
                  (void *)CONCAT44(in_R9D,in_stack_ffffffffffffef18));
  local_7f0.type = emitter_type_uint64;
  local_7f0.field_3.uint64_val = local_140;
  local_818.field_3.uint64_val = rate_per_second(local_140,local_178);
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
               "stats.arenas.0.large.nrequests");
    abort();
  }
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  emitter_json_kv(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28,in_ECX,
                  (void *)CONCAT44(in_R9D,in_stack_ffffffffffffef18));
  local_840.type = emitter_type_uint64;
  local_840.field_3.uint64_val = local_148;
  local_868.field_3.uint64_val = rate_per_second(local_148,local_178);
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
               "stats.arenas.0.large.nfills");
    abort();
  }
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  emitter_json_kv(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28,in_ECX,
                  (void *)CONCAT44(in_R9D,in_stack_ffffffffffffef18));
  local_890.type = emitter_type_uint64;
  local_890.field_3.uint64_val = local_150;
  local_8b8.field_3.uint64_val = rate_per_second(local_150,local_178);
  local_cc0 = 7;
  local_cc8 = 8;
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
               "stats.arenas.0.large.nflushes");
    abort();
  }
  emitter_00 = (emitter_t *)(ulong)local_c;
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  emitter_json_kv(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28,in_ECX,
                  (void *)CONCAT44(in_R9D,in_stack_ffffffffffffef18));
  local_8e0.type = emitter_type_uint64;
  local_8e0.field_3.uint64_val = local_158;
  local_908.field_3.uint64_val = rate_per_second(local_158,local_178);
  emitter_table_row(in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
  emitter_json_object_end((emitter_t *)0x25720ac);
  uptime_00 = "total:";
  local_778.field_3.uint64_val = (uint64_t)(local_100.str_val + local_130.uint64_val);
  local_7a0.field_3.str_val = (char *)(local_108 + local_138);
  local_7f0.field_3.str_val = (char *)(local_110 + local_140);
  local_840.field_3.str_val = (char *)(local_118 + local_148);
  local_890.field_3.str_val = (char *)(local_120 + local_150);
  local_8e0.field_3.str_val = (char *)(local_128 + local_158);
  local_7c8.field_3.uint64_val = rate_per_second(local_7a0.field_3.uint64_val,local_178);
  local_818.field_3.uint64_val = rate_per_second(local_7f0.field_3.uint64_val,local_178);
  local_868.field_3.uint64_val = rate_per_second(local_840.field_3.uint64_val,local_178);
  local_8b8.field_3.uint64_val = rate_per_second(local_890.field_3.uint64_val,local_178);
  local_908.field_3.uint64_val = rate_per_second(local_8e0.field_3.uint64_val,local_178);
  emitter_table_row(in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
  emitter_row_init(&local_cd0);
  emitter_col_init(&local_cf8,&local_cd0);
  local_cf8.justify = emitter_justify_left;
  local_cf8.width = 0x15;
  local_cf8.type = emitter_type_title;
  local_cf8.field_3.str_val = anon_var_dwarf_3eb64fd + 9;
  emitter_col_init(&local_d20,&local_cd0);
  local_d20.justify = emitter_justify_right;
  local_d20.width = 0x10;
  local_d20.type = emitter_type_title;
  local_d20.field_3.str_val = anon_var_dwarf_3eb64fd + 9;
  emitter_table_row(in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
  local_d20.type = emitter_type_size;
  local_cf8.field_3.str_val = "active:";
  local_d20.field_3.uint64_val = local_70 * local_68;
  emitter_table_row(in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n","stats.arenas.0.mapped");
    abort();
  }
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  emitter_json_kv(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28,in_ECX,
                  (void *)CONCAT44(in_R9D,in_stack_ffffffffffffef18));
  local_cf8.field_3.str_val = "mapped:";
  local_d20.field_3 = local_88;
  emitter_table_row(in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n","stats.arenas.0.retained");
    abort();
  }
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  emitter_json_kv(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28,in_ECX,
                  (void *)CONCAT44(in_R9D,in_stack_ffffffffffffef18));
  local_cf8.field_3.str_val = "retained:";
  local_d20.field_3 = local_90;
  emitter_table_row(in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n","stats.arenas.0.base");
    abort();
  }
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  emitter_json_kv(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28,in_ECX,
                  (void *)CONCAT44(in_R9D,in_stack_ffffffffffffef18));
  local_cf8.field_3.str_val = "base:";
  local_d20.field_3 = local_98;
  emitter_table_row(in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
  emitter_02 = (emitter_t *)0x8;
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n","stats.arenas.0.internal");
    abort();
  }
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  emitter_json_kv(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28,in_ECX,
                  (void *)CONCAT44(in_R9D,in_stack_ffffffffffffef18));
  local_cf8.field_3.str_val = "internal:";
  local_d20.field_3 = local_a0;
  emitter_table_row(in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
               "stats.arenas.0.metadata_edata");
    abort();
  }
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  emitter_json_kv(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28,in_ECX,
                  (void *)CONCAT44(in_R9D,in_stack_ffffffffffffef18));
  local_cf8.field_3.str_val = "metadata_edata:";
  local_d20.field_3 = local_b0;
  emitter_table_row(in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
               "stats.arenas.0.metadata_rtree");
    abort();
  }
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  emitter_json_kv(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28,in_ECX,
                  (void *)CONCAT44(in_R9D,in_stack_ffffffffffffef18));
  local_cf8.field_3.str_val = "metadata_rtree:";
  local_d20.field_3 = local_b8;
  emitter_table_row(in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
               "stats.arenas.0.metadata_thp");
    abort();
  }
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  emitter_json_kv(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28,in_ECX,
                  (void *)CONCAT44(in_R9D,in_stack_ffffffffffffef18));
  local_cf8.field_3.str_val = "metadata_thp:";
  local_d20.field_3 = local_c0;
  emitter_table_row(in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
               "stats.arenas.0.tcache_bytes");
    abort();
  }
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  emitter_json_kv(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28,in_ECX,
                  (void *)CONCAT44(in_R9D,in_stack_ffffffffffffef18));
  local_cf8.field_3.str_val = "tcache_bytes:";
  local_d20.field_3 = local_160;
  emitter_table_row(in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
               "stats.arenas.0.tcache_stashed_bytes");
    abort();
  }
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  emitter_json_kv(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28,in_ECX,
                  (void *)CONCAT44(in_R9D,in_stack_ffffffffffffef18));
  local_cf8.field_3.str_val = "tcache_stashed_bytes:";
  local_d20.field_3 = local_168;
  emitter_table_row(in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n","stats.arenas.0.resident");
    abort();
  }
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  emitter_json_kv(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28,in_ECX,
                  (void *)CONCAT44(in_R9D,in_stack_ffffffffffffef18));
  local_cf8.field_3.str_val = "resident:";
  local_d20.field_3 = local_a8;
  emitter_table_row(in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
  iVar1 = duckdb_je_mallctlnametomib
                    ((char *)in_stack_ffffffffffffef30,(size_t *)in_stack_ffffffffffffef28,
                     (size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
               "stats.arenas.0.abandoned_vm");
    abort();
  }
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                     (size_t)in_stack_ffffffffffffef28);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  emitter_json_kv(in_stack_ffffffffffffef30,(char *)in_stack_ffffffffffffef28,in_ECX,
                  (void *)CONCAT44(in_R9D,in_stack_ffffffffffffef18));
  local_cf8.field_3.str_val = "abandoned_vm:";
  local_d20.field_3 = local_170;
  emitter_table_row(in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
  emitter_01 = (emitter_t *)0x7;
  row = (emitter_row_t *)0x8;
  iVar1 = duckdb_je_mallctlnametomib((char *)0x7,(size_t *)0x8,(size_t *)CONCAT44(in_ECX,in_R8D));
  if (iVar1 != 0) {
    duckdb_je_malloc_printf
              ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
               "stats.arenas.0.extent_avail");
    abort();
  }
  iVar1 = duckdb_je_mallctlbymib
                    (in_stack_ffffffffffffef50,(ulong)local_c,in_stack_ffffffffffffef40,
                     in_stack_ffffffffffffef38,emitter_01,(size_t)row);
  if (iVar1 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
    abort();
  }
  emitter_json_kv(emitter_01,(char *)row,in_ECX,(void *)CONCAT44(in_R9D,in_stack_ffffffffffffef18));
  local_cf8.field_3.str_val = "extent_avail:";
  local_d20.field_3 = local_c8;
  emitter_table_row(emitter_01,row);
  if ((local_f & 1) != 0) {
    stats_arena_mutexes_print(emitter_02,in_stack_fffffffffffff1a4,in_stack_fffffffffffff198);
  }
  if ((local_d & 1) != 0) {
    stats_arena_bins_print((emitter_t *)mib_34[1],mib_34[0]._7_1_,(uint)mib_34[0],miblen_34);
  }
  if ((local_e & 1) != 0) {
    stats_arena_lextents_print(emitter_03,in_stack_fffffffffffff564,in_stack_fffffffffffff558);
  }
  if ((local_10 & 1) != 0) {
    stats_arena_extents_print(emitter_00,in_stack_fffffffffffff354);
  }
  if ((local_11 & 1) != 0) {
    stats_arena_hpa_shard_print
              ((emitter_t *)in_stack_fffffffffffff8d0,in_stack_fffffffffffff8cc,(uint64_t)uptime_00)
    ;
  }
  return;
}

Assistant:

JEMALLOC_COLD
static void
stats_arena_print(emitter_t *emitter, unsigned i, bool bins, bool large,
    bool mutex, bool extents, bool hpa) {
	char name[ARENA_NAME_LEN];
	char *namep = name;
	unsigned nthreads;
	const char *dss;
	ssize_t dirty_decay_ms, muzzy_decay_ms;
	size_t page, pactive, pdirty, pmuzzy, mapped, retained;
	size_t base, internal, resident, metadata_edata, metadata_rtree,
	    metadata_thp, extent_avail;
	uint64_t dirty_npurge, dirty_nmadvise, dirty_purged;
	uint64_t muzzy_npurge, muzzy_nmadvise, muzzy_purged;
	size_t small_allocated;
	uint64_t small_nmalloc, small_ndalloc, small_nrequests, small_nfills,
	    small_nflushes;
	size_t large_allocated;
	uint64_t large_nmalloc, large_ndalloc, large_nrequests, large_nfills,
	    large_nflushes;
	size_t tcache_bytes, tcache_stashed_bytes, abandoned_vm;
	uint64_t uptime;

	CTL_GET("arenas.page", &page, size_t);
	if (i != MALLCTL_ARENAS_ALL && i != MALLCTL_ARENAS_DESTROYED) {
		CTL_M1_GET("arena.0.name", i, (void *)&namep, const char *);
		emitter_kv(emitter, "name", "name", emitter_type_string, &namep);
	}

	CTL_M2_GET("stats.arenas.0.nthreads", i, &nthreads, unsigned);
	emitter_kv(emitter, "nthreads", "assigned threads",
	    emitter_type_unsigned, &nthreads);

	CTL_M2_GET("stats.arenas.0.uptime", i, &uptime, uint64_t);
	emitter_kv(emitter, "uptime_ns", "uptime", emitter_type_uint64,
	    &uptime);

	CTL_M2_GET("stats.arenas.0.dss", i, &dss, const char *);
	emitter_kv(emitter, "dss", "dss allocation precedence",
	    emitter_type_string, &dss);

	CTL_M2_GET("stats.arenas.0.dirty_decay_ms", i, &dirty_decay_ms,
	    ssize_t);
	CTL_M2_GET("stats.arenas.0.muzzy_decay_ms", i, &muzzy_decay_ms,
	    ssize_t);
	CTL_M2_GET("stats.arenas.0.pactive", i, &pactive, size_t);
	CTL_M2_GET("stats.arenas.0.pdirty", i, &pdirty, size_t);
	CTL_M2_GET("stats.arenas.0.pmuzzy", i, &pmuzzy, size_t);
	CTL_M2_GET("stats.arenas.0.dirty_npurge", i, &dirty_npurge, uint64_t);
	CTL_M2_GET("stats.arenas.0.dirty_nmadvise", i, &dirty_nmadvise,
	    uint64_t);
	CTL_M2_GET("stats.arenas.0.dirty_purged", i, &dirty_purged, uint64_t);
	CTL_M2_GET("stats.arenas.0.muzzy_npurge", i, &muzzy_npurge, uint64_t);
	CTL_M2_GET("stats.arenas.0.muzzy_nmadvise", i, &muzzy_nmadvise,
	    uint64_t);
	CTL_M2_GET("stats.arenas.0.muzzy_purged", i, &muzzy_purged, uint64_t);

	emitter_row_t decay_row;
	emitter_row_init(&decay_row);

	/* JSON-style emission. */
	emitter_json_kv(emitter, "dirty_decay_ms", emitter_type_ssize,
	    &dirty_decay_ms);
	emitter_json_kv(emitter, "muzzy_decay_ms", emitter_type_ssize,
	    &muzzy_decay_ms);

	emitter_json_kv(emitter, "pactive", emitter_type_size, &pactive);
	emitter_json_kv(emitter, "pdirty", emitter_type_size, &pdirty);
	emitter_json_kv(emitter, "pmuzzy", emitter_type_size, &pmuzzy);

	emitter_json_kv(emitter, "dirty_npurge", emitter_type_uint64,
	    &dirty_npurge);
	emitter_json_kv(emitter, "dirty_nmadvise", emitter_type_uint64,
	    &dirty_nmadvise);
	emitter_json_kv(emitter, "dirty_purged", emitter_type_uint64,
	    &dirty_purged);

	emitter_json_kv(emitter, "muzzy_npurge", emitter_type_uint64,
	    &muzzy_npurge);
	emitter_json_kv(emitter, "muzzy_nmadvise", emitter_type_uint64,
	    &muzzy_nmadvise);
	emitter_json_kv(emitter, "muzzy_purged", emitter_type_uint64,
	    &muzzy_purged);

	/* Table-style emission. */
	COL(decay_row, decay_type, right, 9, title);
	col_decay_type.str_val = "decaying:";

	COL(decay_row, decay_time, right, 6, title);
	col_decay_time.str_val = "time";

	COL(decay_row, decay_npages, right, 13, title);
	col_decay_npages.str_val = "npages";

	COL(decay_row, decay_sweeps, right, 13, title);
	col_decay_sweeps.str_val = "sweeps";

	COL(decay_row, decay_madvises, right, 13, title);
	col_decay_madvises.str_val = "madvises";

	COL(decay_row, decay_purged, right, 13, title);
	col_decay_purged.str_val = "purged";

	/* Title row. */
	emitter_table_row(emitter, &decay_row);

	/* Dirty row. */
	col_decay_type.str_val = "dirty:";

	if (dirty_decay_ms >= 0) {
		col_decay_time.type = emitter_type_ssize;
		col_decay_time.ssize_val = dirty_decay_ms;
	} else {
		col_decay_time.type = emitter_type_title;
		col_decay_time.str_val = "N/A";
	}

	col_decay_npages.type = emitter_type_size;
	col_decay_npages.size_val = pdirty;

	col_decay_sweeps.type = emitter_type_uint64;
	col_decay_sweeps.uint64_val = dirty_npurge;

	col_decay_madvises.type = emitter_type_uint64;
	col_decay_madvises.uint64_val = dirty_nmadvise;

	col_decay_purged.type = emitter_type_uint64;
	col_decay_purged.uint64_val = dirty_purged;

	emitter_table_row(emitter, &decay_row);

	/* Muzzy row. */
	col_decay_type.str_val = "muzzy:";

	if (muzzy_decay_ms >= 0) {
		col_decay_time.type = emitter_type_ssize;
		col_decay_time.ssize_val = muzzy_decay_ms;
	} else {
		col_decay_time.type = emitter_type_title;
		col_decay_time.str_val = "N/A";
	}

	col_decay_npages.type = emitter_type_size;
	col_decay_npages.size_val = pmuzzy;

	col_decay_sweeps.type = emitter_type_uint64;
	col_decay_sweeps.uint64_val = muzzy_npurge;

	col_decay_madvises.type = emitter_type_uint64;
	col_decay_madvises.uint64_val = muzzy_nmadvise;

	col_decay_purged.type = emitter_type_uint64;
	col_decay_purged.uint64_val = muzzy_purged;

	emitter_table_row(emitter, &decay_row);

	/* Small / large / total allocation counts. */
	emitter_row_t alloc_count_row;
	emitter_row_init(&alloc_count_row);

	COL(alloc_count_row, count_title, left, 21, title);
	col_count_title.str_val = "";

	COL(alloc_count_row, count_allocated, right, 16, title);
	col_count_allocated.str_val = "allocated";

	COL(alloc_count_row, count_nmalloc, right, 16, title);
	col_count_nmalloc.str_val = "nmalloc";
	COL(alloc_count_row, count_nmalloc_ps, right, 10, title);
	col_count_nmalloc_ps.str_val = "(#/sec)";

	COL(alloc_count_row, count_ndalloc, right, 16, title);
	col_count_ndalloc.str_val = "ndalloc";
	COL(alloc_count_row, count_ndalloc_ps, right, 10, title);
	col_count_ndalloc_ps.str_val = "(#/sec)";

	COL(alloc_count_row, count_nrequests, right, 16, title);
	col_count_nrequests.str_val = "nrequests";
	COL(alloc_count_row, count_nrequests_ps, right, 10, title);
	col_count_nrequests_ps.str_val = "(#/sec)";

	COL(alloc_count_row, count_nfills, right, 16, title);
	col_count_nfills.str_val = "nfill";
	COL(alloc_count_row, count_nfills_ps, right, 10, title);
	col_count_nfills_ps.str_val = "(#/sec)";

	COL(alloc_count_row, count_nflushes, right, 16, title);
	col_count_nflushes.str_val = "nflush";
	COL(alloc_count_row, count_nflushes_ps, right, 10, title);
	col_count_nflushes_ps.str_val = "(#/sec)";

	emitter_table_row(emitter, &alloc_count_row);

	col_count_nmalloc_ps.type = emitter_type_uint64;
	col_count_ndalloc_ps.type = emitter_type_uint64;
	col_count_nrequests_ps.type = emitter_type_uint64;
	col_count_nfills_ps.type = emitter_type_uint64;
	col_count_nflushes_ps.type = emitter_type_uint64;

#define GET_AND_EMIT_ALLOC_STAT(small_or_large, name, valtype)		\
	CTL_M2_GET("stats.arenas.0." #small_or_large "." #name, i,	\
	    &small_or_large##_##name, valtype##_t);			\
	emitter_json_kv(emitter, #name, emitter_type_##valtype,		\
	    &small_or_large##_##name);					\
	col_count_##name.type = emitter_type_##valtype;		\
	col_count_##name.valtype##_val = small_or_large##_##name;

	emitter_json_object_kv_begin(emitter, "small");
	col_count_title.str_val = "small:";

	GET_AND_EMIT_ALLOC_STAT(small, allocated, size)
	GET_AND_EMIT_ALLOC_STAT(small, nmalloc, uint64)
	col_count_nmalloc_ps.uint64_val =
	    rate_per_second(col_count_nmalloc.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(small, ndalloc, uint64)
	col_count_ndalloc_ps.uint64_val =
	    rate_per_second(col_count_ndalloc.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(small, nrequests, uint64)
	col_count_nrequests_ps.uint64_val =
	    rate_per_second(col_count_nrequests.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(small, nfills, uint64)
	col_count_nfills_ps.uint64_val =
	    rate_per_second(col_count_nfills.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(small, nflushes, uint64)
	col_count_nflushes_ps.uint64_val =
	    rate_per_second(col_count_nflushes.uint64_val, uptime);

	emitter_table_row(emitter, &alloc_count_row);
	emitter_json_object_end(emitter); /* Close "small". */

	emitter_json_object_kv_begin(emitter, "large");
	col_count_title.str_val = "large:";

	GET_AND_EMIT_ALLOC_STAT(large, allocated, size)
	GET_AND_EMIT_ALLOC_STAT(large, nmalloc, uint64)
	col_count_nmalloc_ps.uint64_val =
	    rate_per_second(col_count_nmalloc.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(large, ndalloc, uint64)
	col_count_ndalloc_ps.uint64_val =
	    rate_per_second(col_count_ndalloc.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(large, nrequests, uint64)
	col_count_nrequests_ps.uint64_val =
	    rate_per_second(col_count_nrequests.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(large, nfills, uint64)
	col_count_nfills_ps.uint64_val =
	    rate_per_second(col_count_nfills.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(large, nflushes, uint64)
	col_count_nflushes_ps.uint64_val =
	    rate_per_second(col_count_nflushes.uint64_val, uptime);

	emitter_table_row(emitter, &alloc_count_row);
	emitter_json_object_end(emitter); /* Close "large". */

#undef GET_AND_EMIT_ALLOC_STAT

	/* Aggregated small + large stats are emitter only in table mode. */
	col_count_title.str_val = "total:";
	col_count_allocated.size_val = small_allocated + large_allocated;
	col_count_nmalloc.uint64_val = small_nmalloc + large_nmalloc;
	col_count_ndalloc.uint64_val = small_ndalloc + large_ndalloc;
	col_count_nrequests.uint64_val = small_nrequests + large_nrequests;
	col_count_nfills.uint64_val = small_nfills + large_nfills;
	col_count_nflushes.uint64_val = small_nflushes + large_nflushes;
	col_count_nmalloc_ps.uint64_val =
	    rate_per_second(col_count_nmalloc.uint64_val, uptime);
	col_count_ndalloc_ps.uint64_val =
	    rate_per_second(col_count_ndalloc.uint64_val, uptime);
	col_count_nrequests_ps.uint64_val =
	    rate_per_second(col_count_nrequests.uint64_val, uptime);
	col_count_nfills_ps.uint64_val =
	    rate_per_second(col_count_nfills.uint64_val, uptime);
	col_count_nflushes_ps.uint64_val =
	    rate_per_second(col_count_nflushes.uint64_val, uptime);
	emitter_table_row(emitter, &alloc_count_row);

	emitter_row_t mem_count_row;
	emitter_row_init(&mem_count_row);

	emitter_col_t mem_count_title;
	emitter_col_init(&mem_count_title, &mem_count_row);
	mem_count_title.justify = emitter_justify_left;
	mem_count_title.width = 21;
	mem_count_title.type = emitter_type_title;
	mem_count_title.str_val = "";

	emitter_col_t mem_count_val;
	emitter_col_init(&mem_count_val, &mem_count_row);
	mem_count_val.justify = emitter_justify_right;
	mem_count_val.width = 16;
	mem_count_val.type = emitter_type_title;
	mem_count_val.str_val = "";

	emitter_table_row(emitter, &mem_count_row);
	mem_count_val.type = emitter_type_size;

	/* Active count in bytes is emitted only in table mode. */
	mem_count_title.str_val = "active:";
	mem_count_val.size_val = pactive * page;
	emitter_table_row(emitter, &mem_count_row);

#define GET_AND_EMIT_MEM_STAT(stat)					\
	CTL_M2_GET("stats.arenas.0."#stat, i, &stat, size_t);		\
	emitter_json_kv(emitter, #stat, emitter_type_size, &stat);	\
	mem_count_title.str_val = #stat":";				\
	mem_count_val.size_val = stat;					\
	emitter_table_row(emitter, &mem_count_row);

	GET_AND_EMIT_MEM_STAT(mapped)
	GET_AND_EMIT_MEM_STAT(retained)
	GET_AND_EMIT_MEM_STAT(base)
	GET_AND_EMIT_MEM_STAT(internal)
	GET_AND_EMIT_MEM_STAT(metadata_edata)
	GET_AND_EMIT_MEM_STAT(metadata_rtree)
	GET_AND_EMIT_MEM_STAT(metadata_thp)
	GET_AND_EMIT_MEM_STAT(tcache_bytes)
	GET_AND_EMIT_MEM_STAT(tcache_stashed_bytes)
	GET_AND_EMIT_MEM_STAT(resident)
	GET_AND_EMIT_MEM_STAT(abandoned_vm)
	GET_AND_EMIT_MEM_STAT(extent_avail)
#undef GET_AND_EMIT_MEM_STAT

	if (mutex) {
		stats_arena_mutexes_print(emitter, i, uptime);
	}
	if (bins) {
		stats_arena_bins_print(emitter, mutex, i, uptime);
	}
	if (large) {
		stats_arena_lextents_print(emitter, i, uptime);
	}
	if (extents) {
		stats_arena_extents_print(emitter, i);
	}
	if (hpa) {
		stats_arena_hpa_shard_print(emitter, i, uptime);
	}
}